

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::Float::stPrintString(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  VMContext *context;
  size_t size;
  ByteString *pointer;
  Oop OVar3;
  Oop result;
  char buffer [128];
  allocator local_41;
  string local_40;
  anon_union_8_4_0eb573b0_for_Oop_0 local_20;
  Oop self;
  InterpreterProxy *interpreter_local;
  
  self.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)interpreter;
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    local_20.pointer = (uint8_t *)(**(code **)(*(long *)self.field_0 + 0x58))();
    bVar1 = Oop::isFloat((Oop *)&local_20);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,"expected a small integer.",&local_41);
      nativeError(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    Oop::decodeFloat((Oop *)&local_20);
    snprintf((char *)&result,0x7f,"%f");
    context = (VMContext *)(*(code *)**(undefined8 **)self.field_0)();
    size = strlen((char *)&result);
    pointer = ByteString::fromNativeRange(context,(char *)&result,size);
    OVar3 = Oop::fromPointer(pointer);
    interpreter_local._4_4_ =
         (**(code **)(*(long *)self.field_0 + 0xb8))(self.field_0,OVar3.field_0);
  }
  else {
    interpreter_local._4_4_ = (**(code **)(*(long *)self.field_0 + 0xf0))();
  }
  return interpreter_local._4_4_;
}

Assistant:

int Float::stPrintString(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto self = interpreter->getReceiver();
    if(!self.isFloat())
        nativeError("expected a small integer.");

    char buffer[128];
    snprintf(buffer, 127, "%f", self.decodeFloat());

    auto result = Oop::fromPointer(ByteString::fromNativeRange(interpreter->getContext(), buffer, strlen(buffer)));
    return interpreter->returnOop(result);
}